

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall wallet::LegacyScriptPubKeyMan::UpgradeKeyMetadata(LegacyScriptPubKeyMan *this)

{
  long lVar1;
  WalletStorage *pWVar2;
  bool bVar3;
  int iVar4;
  _Base_ptr p_Var5;
  runtime_error *this_00;
  long in_FS_OFFSET;
  Span<const_std::byte> seed;
  CKey key;
  unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  CPubKey pubkey;
  CKeyID master_id;
  CExtKey masterKey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock6,&(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore
             ,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x197,false);
  iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[10])
                    ();
  if ((char)iVar4 == '\0') {
    pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    iVar4 = (*pWVar2->_vptr_WalletStorage[4])(pWVar2,2);
    if ((char)iVar4 == '\0') {
      (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])();
      std::make_unique<wallet::WalletBatch,wallet::WalletDatabase&>((WalletDatabase *)&batch);
      for (p_Var5 = (this->super_LegacyDataSPKM).mapKeyMetadata._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_left;
          (_Rb_tree_header *)p_Var5 !=
          &(this->super_LegacyDataSPKM).mapKeyMetadata._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
        bVar3 = base_blob<160U>::IsNull((base_blob<160U> *)&p_Var5[3]._M_parent);
        if ((!bVar3) && ((char)p_Var5[5]._M_color == _S_red)) {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&p_Var5[2]._M_parent,"s");
          if (!bVar3) {
            key.fCompressed = false;
            key.keydata._M_t.
            super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
                  )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                    )0x0;
            (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1e])
                      (this,&p_Var5[3]._M_parent,&key);
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
            masterKey.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
            masterKey.key.fCompressed = false;
            masterKey.key.keydata._M_t.
            super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
                  )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                    )0x0;
            seed.m_size._0_4_ =
                 (uint)((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                         )key.keydata._M_t.
                          super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                          _M_head_impl !=
                       (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                        )0x0) << 5;
            seed.m_data = (byte *)key.keydata._M_t.
                                  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                                  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                                  _M_head_impl;
            seed.m_size._4_4_ = 0;
            CExtKey::SetSeed(&masterKey,seed);
            CKey::GetPubKey(&pubkey,&masterKey.key);
            CPubKey::GetID(&master_id,&pubkey);
            p_Var5[4]._M_color = master_id.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_
            ;
            bVar3 = ParseHDKeypath((string *)&p_Var5[2]._M_parent,
                                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &p_Var5[4]._M_parent);
            if (!bVar3) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"Invalid stored hdKeypath");
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              goto LAB_001f1ed0;
            }
            *(undefined1 *)&p_Var5[5]._M_color = _S_black;
            if (*(int *)&p_Var5[1]._M_right < 0xc) {
              *(undefined4 *)&p_Var5[1]._M_right = 0xc;
            }
            pubkey.vch[0] = 0xff;
            iVar4 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1f]
                    )(this,p_Var5 + 1,&pubkey);
            if ((char)iVar4 != '\0') {
              WalletBatch::WriteKeyMetadata
                        ((WalletBatch *)
                         batch._M_t.
                         super___uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>
                         .super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl,
                         (CKeyMetadata *)&p_Var5[1]._M_right,&pubkey,true);
            }
            std::
            unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            ::~unique_ptr(&masterKey.key.keydata);
            std::
            unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            ::~unique_ptr(&key.keydata);
          }
        }
      }
      std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::~unique_ptr
                (&batch);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock6.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_001f1ed0:
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::UpgradeKeyMetadata()
{
    LOCK(cs_KeyStore);
    if (m_storage.IsLocked() || m_storage.IsWalletFlagSet(WALLET_FLAG_KEY_ORIGIN_METADATA)) {
        return;
    }

    std::unique_ptr<WalletBatch> batch = std::make_unique<WalletBatch>(m_storage.GetDatabase());
    for (auto& meta_pair : mapKeyMetadata) {
        CKeyMetadata& meta = meta_pair.second;
        if (!meta.hd_seed_id.IsNull() && !meta.has_key_origin && meta.hdKeypath != "s") { // If the hdKeypath is "s", that's the seed and it doesn't have a key origin
            CKey key;
            GetKey(meta.hd_seed_id, key);
            CExtKey masterKey;
            masterKey.SetSeed(key);
            // Add to map
            CKeyID master_id = masterKey.key.GetPubKey().GetID();
            std::copy(master_id.begin(), master_id.begin() + 4, meta.key_origin.fingerprint);
            if (!ParseHDKeypath(meta.hdKeypath, meta.key_origin.path)) {
                throw std::runtime_error("Invalid stored hdKeypath");
            }
            meta.has_key_origin = true;
            if (meta.nVersion < CKeyMetadata::VERSION_WITH_KEY_ORIGIN) {
                meta.nVersion = CKeyMetadata::VERSION_WITH_KEY_ORIGIN;
            }

            // Write meta to wallet
            CPubKey pubkey;
            if (GetPubKey(meta_pair.first, pubkey)) {
                batch->WriteKeyMetadata(meta, pubkey, true);
            }
        }
    }
}